

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_functions.hpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::VariableReturnBindData::Deserialize
          (Deserializer *deserializer,ScalarFunction *bound_function)

{
  _func_int **pp_Var1;
  LogicalType stype;
  LogicalType local_50;
  LogicalType local_38;
  
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2]
  )(bound_function,100,"variable_return_type");
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[6]
  )(bound_function);
  LogicalType::Deserialize(&local_50,(Deserializer *)bound_function);
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[7]
  )(bound_function);
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3]
  )(bound_function);
  pp_Var1 = (_func_int **)operator_new(0x20);
  LogicalType::LogicalType(&local_38,&local_50);
  *pp_Var1 = (_func_int *)&PTR__VariableReturnBindData_024878a8;
  LogicalType::LogicalType((LogicalType *)(pp_Var1 + 1),&local_38);
  LogicalType::~LogicalType(&local_38);
  deserializer->_vptr_Deserializer = pp_Var1;
  LogicalType::~LogicalType(&local_50);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, ScalarFunction &bound_function) {
		auto stype = deserializer.ReadProperty<LogicalType>(100, "variable_return_type");
		return make_uniq<VariableReturnBindData>(std::move(stype));
	}